

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_validate.c
# Opt level: O3

int cfg_validate_tokens(autobuf *out,char *section_name,char *entry_name,char *value,
                       cfg_schema_entry *entries,size_t entry_count,
                       cfg_schema_token_customizer *custom)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  char *src;
  uint uVar4;
  ulong uVar5;
  cfg_schema_entry *pcVar6;
  ulong uVar7;
  char section_name_entry [32];
  char buffer [256];
  char local_158 [32];
  char local_138 [264];
  
  if (custom == (cfg_schema_token_customizer *)0x0) {
    uVar5 = 0;
  }
  else {
    uVar5 = (ulong)custom->optional;
  }
  sVar3 = str_countwords(value);
  if ((sVar3 & 0xffffffff) < entry_count - uVar5) {
    cfg_append_printable_line
              (out,
               "Missing token for entry \'%s\' in section %s. At least %zu tokens expected. Tokens must be separated by whitespaces."
               ,entry_name,section_name,entry_count);
LAB_0010e8d3:
    iVar1 = -1;
  }
  else {
    snprintf(local_158,0x20,"%s.%s",section_name,entry_name);
    uVar4 = (int)sVar3 - 1;
    uVar5 = (ulong)uVar4;
    src = value;
    if (uVar4 != 0) {
      pcVar6 = entries;
      uVar7 = uVar5;
      do {
        src = str_cpynextword(local_138,src,0x100);
        iVar1 = (*pcVar6->cb_validate)(pcVar6,local_158,local_138,out);
        if (iVar1 != 0) goto LAB_0010e8d3;
        pcVar6 = pcVar6 + 1;
        uVar7 = uVar7 - 1;
      } while (uVar7 != 0);
    }
    iVar2 = (*entries[uVar5].cb_validate)(entries + uVar5,local_158,src,out);
    iVar1 = -(uint)(iVar2 != 0);
    if ((custom != (cfg_schema_token_customizer *)0x0) && (iVar2 == 0)) {
      if (custom->cb_validator ==
          (_func_int_autobuf_ptr_char_ptr_char_ptr_char_ptr_cfg_schema_entry_ptr_size_t *)0x0) {
        iVar1 = 0;
      }
      else {
        iVar1 = (*custom->cb_validator)(out,section_name,entry_name,value,entries,entry_count);
      }
    }
  }
  return iVar1;
}

Assistant:

int
cfg_validate_tokens(struct autobuf *out, const char *section_name, const char *entry_name, const char *value,
  struct cfg_schema_entry *entries, size_t entry_count, struct cfg_schema_token_customizer *custom) {
  char buffer[256];
  char section_name_entry[32];
  const char *ptr;
  uint32_t parameter_count, optional;
  size_t i;

  optional = custom != NULL ? custom->optional : 0;

  parameter_count = str_countwords(value);
  if (parameter_count < entry_count - optional) {
    cfg_append_printable_line(out,
      "Missing token for entry '%s'"
      " in section %s. At least %" PRINTF_SIZE_T_SPECIFIER " tokens"
      " expected. Tokens must be separated by whitespaces.",
      entry_name, section_name, entry_count);
    return -1;
  }
  snprintf(section_name_entry, sizeof(section_name_entry), "%s.%s", section_name, entry_name);

  /* check each token */
  ptr = value;
  for (i = 0; i < parameter_count-1; i++) {
    ptr = str_cpynextword(buffer, ptr, sizeof(buffer));

    /* see if token is valid */
    if (entries[i].cb_validate(&entries[i], section_name_entry, buffer, out)) {
      return -1;
    }
  }

  /* see if the rest of the value is a valid "last" token */
  if (entries[parameter_count - 1].cb_validate(&entries[parameter_count - 1], section_name_entry, ptr, out)) {
    return -1;
  }

  if (custom && custom->cb_validator) {
    return custom->cb_validator(out, section_name, entry_name, value, entries, entry_count);
  }
  return 0;
}